

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.hpp
# Opt level: O3

container<pstore::repo::external_fixup> __thiscall
pstore::repo::section_dispatcher::xfixups(section_dispatcher *this)

{
  generic_section *this_00;
  container<unsigned_char> cVar1;
  container<pstore::repo::external_fixup> cVar2;
  
  this_00 = this->s_;
  cVar1 = generic_section::payload(this_00);
  cVar2.begin_ = (const_pointer)
                 ((ulong)(cVar1.end_ + (ulong)((this_00->field_0).field32_ >> 8) * 0x18 + 7) &
                 0xfffffffffffffff8);
  cVar2.end_ = cVar2.begin_ + this_00->num_xfixups_;
  return cVar2;
}

Assistant:

container<external_fixup> xfixups () const final { return s_.xfixups (); }